

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::err_handler_(logger *this,string *msg)

{
  size_t sVar1;
  FILE *__stream;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char local_d8 [8];
  char date_buf [64];
  time_t local_90;
  undefined1 local_88 [8];
  tm tm_time;
  duration<long,_std::ratio<1L,_1L>_> local_48 [3];
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point now;
  lock_guard<std::mutex> lk;
  string *msg_local;
  logger *this_local;
  
  bVar2 = std::function::operator_cast_to_bool((function *)&this->custom_err_handler_);
  if (bVar2) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->custom_err_handler_,msg);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&now,&err_handler_::mutex);
    local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    err_handler_::err_counter = err_handler_::err_counter + 1;
    local_30.__r = (rep)std::chrono::operator-(&local_28,&err_handler_::last_report_time);
    tm_time.tm_zone._4_4_ = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)local_48,(int *)((long)&tm_time.tm_zone + 4));
    tm_time.tm_zone._0_1_ = std::chrono::operator<(&local_30,local_48);
    if (!tm_time.tm_zone._0_1_) {
      err_handler_::last_report_time.__d.__r = local_28.__d.__r;
      local_90 = std::chrono::_V2::system_clock::to_time_t(&local_28);
      details::os::localtime((os *)local_88,&local_90);
      strftime(local_d8,0x40,"%Y-%m-%d %H:%M:%S",(tm *)local_88);
      __stream = _stderr;
      sVar1 = err_handler_::err_counter;
      name_abi_cxx11_(this);
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,"[*** LOG ERROR #%04zu ***] [%s] [%s] {%s}\n",sVar1,local_d8,uVar3,uVar4);
    }
    tm_time.tm_zone._1_3_ = 0;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::err_handler_(const std::string &msg)
{
    if (custom_err_handler_)
    {
        custom_err_handler_(msg);
    }
    else
    {
        using std::chrono::system_clock;
        static std::mutex mutex;
        static std::chrono::system_clock::time_point last_report_time;
        static size_t err_counter = 0;
        std::lock_guard<std::mutex> lk{mutex};
        auto now = system_clock::now();
        err_counter++;
        if (now - last_report_time < std::chrono::seconds(1))
        {
            return;
        }
        last_report_time = now;
        auto tm_time = details::os::localtime(system_clock::to_time_t(now));
        char date_buf[64];
        std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
#if defined(USING_R) && defined(R_R_H) // if in R environment
        REprintf("[*** LOG ERROR #%04zu ***] [%s] [%s] {%s}\n", err_counter, date_buf, name().c_str(), msg.c_str());
#else
        std::fprintf(stderr, "[*** LOG ERROR #%04zu ***] [%s] [%s] {%s}\n", err_counter, date_buf, name().c_str(), msg.c_str());
#endif
    }
}